

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  string_view value;
  int iVar1;
  uint32_t *puVar2;
  Arena *arena;
  MethodDescriptor *this_00;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar3;
  ServiceOptions *pSVar4;
  int local_54;
  undefined1 auStack_50 [4];
  int i;
  ServiceDescriptorProto *local_40;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *this_local;
  char *local_28;
  undefined8 *local_20;
  ServiceDescriptorProto *local_18;
  anon_union_48_1_493b367e_for_ServiceDescriptorProto_3 *local_10;
  
  local_40 = proto;
  proto_local = (ServiceDescriptorProto *)this;
  _auStack_50 = name(this);
  local_20 = (undefined8 *)auStack_50;
  local_10 = &proto->field_0;
  local_18 = proto;
  puVar2 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar2 = *puVar2 | 1;
  this_local = (ServiceDescriptor *)*local_20;
  local_28 = (char *)local_20[1];
  arena = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_28;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  local_54 = 0;
  while( true ) {
    iVar1 = method_count(this);
    if (iVar1 <= local_54) break;
    this_00 = method(this,local_54);
    proto_00 = ServiceDescriptorProto::add_method(local_40);
    MethodDescriptor::CopyTo(this_00,proto_00);
    local_54 = local_54 + 1;
  }
  pSVar3 = options(this);
  pSVar4 = ServiceOptions::default_instance();
  if (pSVar3 != pSVar4) {
    pSVar3 = options(this);
    pSVar4 = ServiceDescriptorProto::mutable_options(local_40);
    ServiceOptions::operator=(pSVar4,pSVar3);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::ServiceDescriptorProto>
            (this->proto_features_,local_40);
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}